

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_getfenv(lua_State *L)

{
  cTValue *pcVar1;
  TValue *pTVar2;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar3;
  GCRef *pGVar4;
  int level;
  int32_t local_c;
  
  pTVar2 = L->top;
  if ((pTVar2 <= L->base) || (aVar3 = L->base->field_4, aVar3.it >> 0xf != 0x1fff7)) {
    local_c = lj_lib_optint(L,1,1);
    pcVar1 = lj_debug_frame(L,local_c,&local_c);
    if (pcVar1 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
    aVar3 = (anon_struct_8_2_7fa0a05d_for_TValue_4)pcVar1[-1].u64;
    pTVar2 = L->top;
  }
  L->top = pTVar2 + 1;
  pGVar4 = &L->env;
  if (*(char *)(((ulong)aVar3 & 0x7fffffffffff) + 10) == '\0') {
    pGVar4 = (GCRef *)(((ulong)aVar3 & 0x7fffffffffff) + 0x10);
  }
  pTVar2->u64 = pGVar4->gcptr64 | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(getfenv)		LJLIB_REC(.)
{
  GCfunc *fn;
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_optint(L, 1, 1);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    if (LJ_FR2) o--;
  }
  fn = &gcval(o)->fn;
  settabV(L, L->top++, isluafunc(fn) ? tabref(fn->l.env) : tabref(L->env));
  return 1;
}